

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

uint32 rw::geoStructSize(Geometry *geo)

{
  uint uVar1;
  uint32 uVar2;
  long lVar3;
  
  uVar2 = 0x10;
  if (version < 0x34000) {
    uVar2 = 0x1c;
  }
  uVar1 = geo->flags;
  if ((uVar1 >> 0x18 & 1) == 0) {
    if ((uVar1 & 8) != 0) {
      uVar2 = uVar2 + geo->numVertices * 4;
    }
    if (0 < geo->numTexCoordSets) {
      uVar2 = uVar2 + geo->numTexCoordSets * geo->numVertices * 8;
    }
    uVar2 = uVar2 + geo->numTriangles * 8;
  }
  if (0 < (long)geo->numMorphTargets) {
    lVar3 = 0;
    do {
      uVar2 = uVar2 + 0x18;
      if ((uVar1 >> 0x18 & 1) == 0) {
        if (*(long *)((long)&geo->morphTargets->vertices + lVar3) != 0) {
          uVar2 = uVar2 + geo->numVertices * 0xc;
        }
        if (*(long *)((long)&geo->morphTargets->normals + lVar3) != 0) {
          uVar2 = uVar2 + geo->numVertices * 0xc;
        }
      }
      lVar3 = lVar3 + 0x28;
    } while ((long)geo->numMorphTargets * 0x28 != lVar3);
  }
  return uVar2;
}

Assistant:

static uint32
geoStructSize(Geometry *geo)
{
	uint32 size = 0;
	size += sizeof(GeoStreamData);
	if(version < 0x34000)
		size += 12;	// surface properties
	if(!(geo->flags & Geometry::NATIVE)){
		if(geo->flags&geo->PRELIT)
			size += 4*geo->numVertices;
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			size += 2*geo->numVertices*4;
		size += 4*geo->numTriangles*2;
	}
	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		size += 4*4 + 2*4; // bounding sphere and bools
		if(!(geo->flags & Geometry::NATIVE)){
			if(m->vertices)
				size += 3*geo->numVertices*4;
			if(m->normals)
				size += 3*geo->numVertices*4;
		}
	}
	return size;
}